

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::Coap::Coap(Coap *this,event_base *aEventBase,Endpoint *aEndpoint)

{
  Endpoint *pEVar1;
  anon_class_8_1_8991fb9c local_90;
  Receiver local_88;
  duration<long,_std::ratio<1L,_1L>_> local_68;
  Duration local_60 [3];
  anon_class_8_1_8991fb9c local_48;
  Action local_40;
  Endpoint *local_20;
  Endpoint *aEndpoint_local;
  event_base *aEventBase_local;
  Coap *this_local;
  
  this->_vptr_Coap = (_func_int **)&PTR__Coap_0046ac08;
  this->mMessageId = 0;
  local_20 = aEndpoint;
  aEndpoint_local = (Endpoint *)aEventBase;
  aEventBase_local = (event_base *)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>_>
  ::map(&this->mResources);
  pEVar1 = aEndpoint_local;
  local_48.this = this;
  std::function<void(ot::commissioner::Timer&)>::
  function<ot::commissioner::coap::Coap::Coap(event_base*,ot::commissioner::Endpoint&)::__0,void>
            ((function<void(ot::commissioner::Timer&)> *)&local_40,&local_48);
  RequestsCache::RequestsCache(&this->mRequestsCache,(event_base *)pEVar1,&local_40);
  std::function<void_(ot::commissioner::Timer_&)>::~function(&local_40);
  pEVar1 = aEndpoint_local;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_68,&kExchangeLifetime);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000l>> *)local_60,&local_68);
  ResponsesCache::ResponsesCache(&this->mResponsesCache,(event_base *)pEVar1,local_60);
  std::function<void_(const_ot::commissioner::coap::Message_&)>::function
            (&this->mDefaultHandler,(nullptr_t)0x0);
  this->mEndpoint = local_20;
  pEVar1 = this->mEndpoint;
  local_90.this = this;
  std::
  function<void(ot::commissioner::Endpoint&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
  ::function<ot::commissioner::coap::Coap::Coap(event_base*,ot::commissioner::Endpoint&)::__1,void>
            ((function<void(ot::commissioner::Endpoint&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
              *)&local_88,&local_90);
  Endpoint::SetReceiver(pEVar1,&local_88);
  std::
  function<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::~function(&local_88);
  return;
}

Assistant:

Coap::Coap(struct event_base *aEventBase, Endpoint &aEndpoint)
    : mMessageId(0)
    , mRequestsCache(aEventBase, [this](Timer &aTimer) { Retransmit(aTimer); })
    , mResponsesCache(aEventBase, std::chrono::seconds(kExchangeLifetime))
    , mDefaultHandler(nullptr)
    , mEndpoint(aEndpoint)
{
    using namespace std::placeholders;
    mEndpoint.SetReceiver([this](Endpoint &aEndpoint, const ByteArray &aBuf) { Receive(aEndpoint, aBuf); });
}